

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O1

float closest_point_ray_segment(vec3 p1,vec3 q1,vec3 p2,vec3 q2,float *s,float *t,vec3 *c1,vec3 *c2)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined8 uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  
  fVar4 = p2.z;
  uVar11 = p2._0_8_;
  fVar6 = p1.z;
  fVar3 = p1.x;
  fVar5 = p1.y;
  fVar16 = p2.x;
  fVar14 = p2.y;
  fVar8 = q1.x - fVar3;
  fVar9 = q1.y - fVar5;
  fVar10 = q1.z - fVar6;
  fVar15 = q2.x - fVar16;
  fVar17 = q2.y - fVar14;
  fVar12 = q2.z - fVar4;
  fVar19 = fVar10 * fVar10 + fVar8 * fVar8 + fVar9 * fVar9;
  fVar20 = fVar12 * fVar12 + fVar15 * fVar15 + fVar17 * fVar17;
  if ((1e-05 < fVar19) || (1e-05 < fVar20)) {
    fVar22 = fVar12 * (fVar6 - fVar4) + fVar15 * (fVar3 - fVar16) + fVar17 * (fVar5 - fVar14);
    if (1e-05 < fVar19) {
      fVar21 = (fVar6 - fVar4) * fVar10 + (fVar3 - fVar16) * fVar8 + (fVar5 - fVar14) * fVar9;
      if (fVar20 <= 1e-05) {
        *t = 0.0;
        *s = -fVar21 / fVar19;
      }
      else {
        fVar13 = fVar10 * fVar12 + fVar8 * fVar15 + fVar9 * fVar17;
        fVar7 = fVar19 * fVar20 - fVar13 * fVar13;
        fVar18 = 0.0;
        if ((fVar7 != 0.0) || (NAN(fVar7))) {
          fVar18 = (fVar13 * fVar22 - fVar20 * fVar21) / fVar7;
        }
        *s = fVar18;
        fVar20 = (fVar18 * fVar13 + fVar22) / fVar20;
        *t = fVar20;
        if (fVar20 < 0.0) {
          *t = 0.0;
          *s = -fVar21 / fVar19;
        }
        else if (1.0 < fVar20) {
          *t = 1.0;
          *s = (fVar13 - fVar21) / fVar19;
        }
      }
    }
    else {
      *s = 0.0;
      fVar22 = fVar22 / fVar20;
      fVar20 = 1.0;
      if (fVar22 <= 1.0) {
        fVar20 = fVar22;
      }
      *t = (float)(~-(uint)(fVar22 < 0.0) & (uint)fVar20);
    }
    fVar20 = *s;
    c1->x = fVar8 * fVar20 + fVar3;
    c1->y = fVar9 * fVar20 + fVar5;
    c1->z = fVar10 * fVar20 + fVar6;
    fVar3 = *t;
    fVar16 = fVar15 * fVar3 + fVar16;
    fVar14 = fVar17 * fVar3 + fVar14;
    fVar4 = fVar4 + fVar12 * fVar3;
    uVar11 = CONCAT44(fVar14,fVar16);
  }
  else {
    *t = 0.0;
    *s = 0.0;
    c1->x = (float)(int)p1._0_8_;
    c1->y = (float)(int)((ulong)p1._0_8_ >> 0x20);
    c1->z = fVar6;
  }
  c2->x = (float)(int)uVar11;
  c2->y = (float)(int)((ulong)uVar11 >> 0x20);
  c2->z = fVar4;
  uVar1 = c1->x;
  uVar2 = c1->y;
  fVar4 = c1->z - fVar4;
  return fVar4 * fVar4 +
         ((float)uVar1 - fVar16) * ((float)uVar1 - fVar16) +
         ((float)uVar2 - fVar14) * ((float)uVar2 - fVar14);
}

Assistant:

float closest_point_ray_segment(vec3 p1, vec3 q1, vec3 p2, vec3 q2, float *s, float *t, vec3 *c1, vec3 *c2) {
    vec3 d1 = vec3_sub(q1, p1);
    vec3 d2 = vec3_sub(q2, p2);
    vec3 r = vec3_sub(p1, p2);
    float a = vec3_dot(d1, d1);
    float e = vec3_dot(d2, d2);
    float f = vec3_dot(d2, r);

    if (a <= EPSILON && e <= EPSILON) {
        *s = *t = 0.0f;
        *c1 = p1;
        *c2 = p2;
        return vec3_dot(vec3_sub(*c1, *c2), vec3_sub(*c1, *c2)); 
    }
    if (a <= EPSILON) {
        *s = 0.0f;
        *t = f / e;
        *t = clamp(*t, 0.0f, 1.0f);
    } else {
        float c = vec3_dot(d1, r);
        if (e <= EPSILON) {
            *t = 0.0f;
            *s = -c / a;
        } else {
            float b = vec3_dot(d1, d2);
            float denom = a*e - b*b;

            if (denom != 0.0f) {
                *s = (b*f - c*e) / denom;
            } else {
                *s = 0.0f;
            }
            *t = (b*(*s) + f) / e;

            if (*t < 0.0f) {
                *t = 0.0f;
                *s = -c / a;
            } else if (*t > 1.0f) {
                *t = 1.0f;
                *s = (b - c) / a;
            }
        }
    }

    *c1 = vec3_add(p1, vec3_scale(d1, *s));
    *c2 = vec3_add(p2, vec3_scale(d2, *t));
    return vec3_dot(vec3_sub(*c1, *c2), vec3_sub(*c1, *c2));
}